

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t write_new_bucket(int idx,linear_hash_table_t *linear_hash)

{
  int iVar1;
  FILE *__s;
  array_list_t *array_list;
  void *__ptr;
  long bucket_loc_00;
  int iVar2;
  size_t sVar3;
  long lVar4;
  undefined8 uStack_60;
  void *local_58 [2];
  int iStack_44;
  ion_err_t err;
  long lStack_40;
  int i;
  unsigned_long __vla_expr0;
  long local_30;
  ion_fpos_t bucket_loc;
  linear_hash_bucket_t bucket;
  linear_hash_table_t *linear_hash_local;
  int idx_local;
  
  if (linear_hash->database == (FILE *)0x0) {
    linear_hash_local._7_1_ = '\t';
  }
  else {
    bucket_loc._4_4_ = 0;
    bucket.idx = -1;
    bucket.record_count = -1;
    uStack_60 = 0x10374e;
    bucket_loc._0_4_ = idx;
    bucket.overflow_location = (ion_fpos_t)linear_hash;
    iVar2 = fseek((FILE *)linear_hash->database,0,2);
    if (iVar2 == 0) {
      uStack_60 = 0x10376c;
      local_30 = ftell(*(FILE **)(bucket.overflow_location + 0x48));
      uStack_60 = 0x10378b;
      sVar3 = fwrite(&bucket_loc,0x10,1,*(FILE **)(bucket.overflow_location + 0x48));
      if (sVar3 == 1) {
        lVar4 = (long)(*(int *)(bucket.overflow_location + 4) +
                      *(int *)(bucket.overflow_location + 8));
        lStack_40 = lVar4 + 4;
        lVar4 = -(lVar4 + 0x13U & 0xfffffffffffffff0);
        iVar2 = *(int *)(bucket.overflow_location + 4);
        iVar1 = *(int *)(bucket.overflow_location + 8);
        local_58[0] = (void *)((long)local_58 + lVar4);
        __vla_expr0 = (unsigned_long)local_58;
        *(undefined8 *)((long)local_58 + lVar4 + -8) = 0x1037ef;
        memset((void *)((long)local_58 + lVar4),0,(long)(iVar2 + iVar1));
        for (iStack_44 = 0; bucket_loc_00 = local_30, __ptr = local_58[0],
            iStack_44 < *(int *)(bucket.overflow_location + 0x38); iStack_44 = iStack_44 + 1) {
          iVar2 = *(int *)(bucket.overflow_location + 4);
          iVar1 = *(int *)(bucket.overflow_location + 8);
          __s = *(FILE **)(bucket.overflow_location + 0x48);
          *(undefined8 *)((long)local_58 + lVar4 + -8) = 0x10382d;
          sVar3 = fwrite(__ptr,(long)(iVar2 + iVar1) + 4,1,__s);
          if (sVar3 != 1) {
            return '\a';
          }
        }
        array_list = *(array_list_t **)(bucket.overflow_location + 0x58);
        *(undefined8 *)((long)local_58 + lVar4 + -8) = 0x103868;
        linear_hash_local._7_1_ = array_list_insert(idx,bucket_loc_00,array_list);
        if (linear_hash_local._7_1_ == '\0') {
          linear_hash_local._7_1_ = '\0';
        }
      }
      else {
        linear_hash_local._7_1_ = '\a';
      }
    }
    else {
      linear_hash_local._7_1_ = '\r';
    }
  }
  return linear_hash_local._7_1_;
}

Assistant:

ion_err_t
write_new_bucket(
	int					idx,
	linear_hash_table_t *linear_hash
) {
	if (linear_hash->database == NULL) {
		return err_file_open_error;
	}

	linear_hash_bucket_t bucket;

	/* initialize bucket fields */
	bucket.idx					= idx;
	bucket.record_count			= 0;
	bucket.overflow_location	= linear_hash_end_of_list;

	/* seek to end of file to append new bucket */
	ion_fpos_t bucket_loc;

	if (0 != fseek(linear_hash->database, 0, SEEK_END)) {
		return err_file_bad_seek;
	}

	bucket_loc = ftell(linear_hash->database);

	/* write bucket data to file */
	if (1 != fwrite(&bucket, sizeof(linear_hash_bucket_t), 1, linear_hash->database)) {
		return err_file_write_error;
	}

	/* write bucket data to file */
	ion_byte_t record_blank[linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(linear_hash_record_status_empty)];

	memset(record_blank, 0, linear_hash->super.record.key_size + linear_hash->super.record.value_size);

	int i;

	for (i = 0; i < linear_hash->records_per_bucket; i++) {
		if (1 != fwrite(record_blank, linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(linear_hash_record_status_empty), 1, linear_hash->database)) {
			return err_file_write_error;
		}
	}

	/* write bucket_loc in mapping */
	/* store_bucket_loc_in_map(idx, bucket_loc, linear_hash); */
	ion_err_t err = array_list_insert(idx, bucket_loc, linear_hash->bucket_map);

	if (err != err_ok) {
		return err;
	}

	return err_ok;
}